

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall TestParser_TestException_Test::TestBody(TestParser_TestException_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  Lexer *l_00;
  Parser *this_00;
  char *pcVar3;
  char *in_R9;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Program *program;
  Parser *parser;
  Lexer *local_50;
  Lexer *l;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string buff;
  TestParser_TestException_Test *this_local;
  
  buff.field_2._8_8_ = this;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n                ----- test_exception ------\n            ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "(-\n                    (]\n                    -=\n                    =-\n                    ++\n                    --\n                    /)\n                    -+\n                    )-\n                    --\n                    !)\n                    ("
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string
            ((string *)&parser,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  l_00 = lexer::Lexer::New((string *)&parser);
  std::__cxx11::string::~string((string *)&parser);
  local_50 = l_00;
  this_00 = ::parser::Parser::New(l_00);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::parser::Parser::parseProgram(this_00);
  local_91 = ::parser::Parser::hasErrors(this_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_90,
               (AssertionResult *)"parser->hasErrors()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/beesaferoot[P]beesafe/Tests/test_parser.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d9 = std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::empty
                       ((vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *)
                        ((long)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x10));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)local_d8,(AssertionResult *)0x19d122,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/beesaferoot[P]beesafe/Tests/test_parser.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  poVar2 = ast::operator<<((ostream *)&std::cout,
                           (Program *)
                           gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(TestParser, TestException){
    cout << R"(
                ----- test_exception ------
            )" << endl;
    string buff = R"((-
                    (]
                    -=
                    =-
                    ++
                    --
                    /)
                    -+
                    )-
                    --
                    !)
                    ()";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(parser->hasErrors());
    EXPECT_TRUE(program->Stmts.empty());
    cout << program << endl;
}